

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O3

UINT8 device_start_c6280_ootake(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  huc6280_state *info;
  DEV_DATA DVar2;
  UINT8 UVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  void *pvVar10;
  
  uVar6 = cfg->clock;
  uVar4 = uVar6 >> 4;
  if (cfg->srMode == '\x02') {
    if (uVar4 <= cfg->smplRate) {
      uVar4 = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    uVar4 = cfg->smplRate;
  }
  if (_bTblInit == '\0') {
    _VolumeTable[0] = 0;
    lVar7 = 1;
    iVar8 = 0x5a;
    do {
      dVar9 = pow(10.0,((double)iVar8 * -1.08689999991) / 20.0);
      _VolumeTable[lVar7] = (int)(dVar9 * 32768.0);
      lVar7 = lVar7 + 1;
      iVar8 = iVar8 + -1;
    } while (lVar7 != 0x5c);
    uVar1 = 0x100;
    lVar7 = 0;
    do {
      uVar5 = uVar1 & 1;
      uVar1 = ((uVar1 ^ uVar1 >> 1) & 1) << 0xe | uVar1 >> 1;
      *(uint *)((long)_NoiseTable + lVar7) = -(uint)(uVar5 == 0) | 0xffffffee;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x20000);
    _bTblInit = '\x01';
  }
  DVar2.chipInf = calloc(1,0x678);
  if (DVar2.chipInf == (void *)0x0) {
    UVar3 = 0xff;
  }
  else {
    pvVar10 = (void *)(double)uVar6;
    ((DEV_DATA *)((long)DVar2.chipInf + 0x10))->chipInf = pvVar10;
    ((DEV_DATA *)((long)DVar2.chipInf + 0x640))->chipInf = (void *)0x3f80cd578fb0f835;
    *(undefined8 *)((long)DVar2.chipInf + 0x648) = 0x3f80000000000000;
    lVar7 = 0;
    do {
      do {
        *(undefined4 *)
         ((long)DVar2.chipInf +
         lVar7 * 4 +
         (ulong)*(uint *)&((DEV_DATA *)((long)DVar2.chipInf + 0x620))->chipInf * 0xb8 + 0x3c) = 0x11
        ;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      uVar6 = *(int *)&((DEV_DATA *)((long)DVar2.chipInf + 0x620))->chipInf + 1;
      *(uint *)&((DEV_DATA *)((long)DVar2.chipInf + 0x620))->chipInf = uVar6;
      lVar7 = 0;
    } while (uVar6 < 6);
    UVar3 = '\0';
    *(undefined4 *)&((DEV_DATA *)((long)DVar2.chipInf + 0x620))->chipInf = 0;
    *(undefined4 *)&((DEV_DATA *)((long)DVar2.chipInf + 0x650))->chipInf = 0;
    *(undefined2 *)((long)DVar2.chipInf + 0x654) = 0;
    ((DEV_DATA *)((long)DVar2.chipInf + 8))->chipInf = (void *)(double)uVar4;
    ((DEV_DATA *)((long)DVar2.chipInf + 0x18))->chipInf = (void *)((double)pvVar10 / (double)uVar4);
    *(UINT8 *)&((DEV_DATA *)((long)DVar2.chipInf + 0x670))->chipInf = cfg->flags;
    *(void **)DVar2.chipInf = DVar2.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = uVar4;
    retDevInf->devDef = &devDef_C6280_Ootake;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_c6280_ootake(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 16;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = OPSG_Init(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	OPSG_SetHoneyInTheSky(chip, cfg->flags);
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_C6280_Ootake);
	return 0x00;
}